

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

int event_add_nolock_(event *ev,timeval *tv,int tv_is_absolute)

{
  __suseconds_t *p_Var1;
  timeval *ptVar2;
  ushort uVar3;
  event_base *base;
  unsigned_long uVar4;
  short *psVar5;
  event_callback *peVar6;
  event_callback *peVar7;
  void *pvVar8;
  void *pvVar9;
  long *plVar10;
  event_debug_entry *peVar11;
  long lVar12;
  __suseconds_t _Var13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  event **ppeVar18;
  unsigned_long uVar19;
  long lVar20;
  event *peVar21;
  event_debug_entry *peVar22;
  char *pcVar23;
  long lVar24;
  event ***pppeVar25;
  ulong uVar26;
  uint u;
  char *pcVar27;
  event ***pppeVar28;
  char *pcVar29;
  char *pcVar30;
  uint uVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  timeval now;
  timeval local_48;
  
  base = ev->ev_base;
  if (((base->th_base_lock == (void *)0x0) || (evthread_lock_debugging_enabled_ == 0)) ||
     (iVar14 = evthread_is_debug_lock_held_(base->th_base_lock), iVar14 != 0)) {
    event_debug_assert_is_setup_(ev);
    if (event_debug_logging_mask_ != 0) {
      uVar3 = ev->ev_events;
      pcVar23 = "EV_READ ";
      if ((uVar3 & 2) == 0) {
        pcVar23 = " ";
      }
      pcVar27 = "EV_WRITE ";
      if ((uVar3 & 4) == 0) {
        pcVar27 = " ";
      }
      pcVar29 = "EV_CLOSED ";
      if (-1 < (char)uVar3) {
        pcVar29 = " ";
      }
      pcVar30 = "EV_TIMEOUT ";
      if (tv == (timeval *)0x0) {
        pcVar30 = " ";
      }
      event_debugx_("event_add: event: %p (fd %d), %s%s%s%scall %p",ev,(ulong)(uint)ev->ev_fd,
                    pcVar23,pcVar27,pcVar29,pcVar30,(ev->ev_evcallback).evcb_cb_union.evcb_callback)
      ;
    }
    uVar3 = (ev->ev_evcallback).evcb_flags;
    if (0xff < uVar3) {
      event_add_nolock__cold_1();
LAB_0023071a:
      event_add_nolock__cold_5();
      goto LAB_0023071f;
    }
    if ((uVar3 & 0x40) != 0) {
      return -1;
    }
    if ((uVar3 & 1) == 0 && tv != (timeval *)0x0) {
      uVar16 = (base->timeheap).a;
      uVar15 = (base->timeheap).n + 1;
      if (uVar16 < uVar15) {
        uVar31 = 8;
        if (uVar16 != 0) {
          uVar31 = uVar16 * 2;
        }
        if (uVar31 <= uVar15) {
          uVar31 = uVar15;
        }
        ppeVar18 = (base->timeheap).p;
        if (mm_realloc_fn_ == (_func_void_ptr_void_ptr_size_t *)0x0) {
          ppeVar18 = (event **)realloc(ppeVar18,(ulong)uVar31 * 8);
        }
        else {
          ppeVar18 = (event **)(*mm_realloc_fn_)(ppeVar18,(ulong)uVar31 * 8);
        }
        if (ppeVar18 == (event **)0x0) {
          return -1;
        }
        (base->timeheap).p = ppeVar18;
        (base->timeheap).a = uVar31;
      }
    }
    if ((((event *)base->current_event == ev) &&
        (evthread_id_fn_ != (_func_unsigned_long *)0x0 && (ev->ev_events & 8) != 0)) &&
       (uVar4 = base->th_owner_id, uVar19 = (*evthread_id_fn_)(), uVar4 != uVar19)) {
      base->current_event_waiters = base->current_event_waiters + 1;
      if (base->current_event_cond != (void *)0x0) {
        (*evthread_cond_fns_.wait_condition)
                  (base->current_event_cond,base->th_base_lock,(timeval *)0x0);
      }
    }
    uVar3 = ev->ev_events;
    bVar32 = false;
    if (((uVar3 & 0x8e) == 0) || (((ev->ev_evcallback).evcb_flags & 0x2a) != 0)) {
      iVar14 = 0;
LAB_00230185:
      if ((tv == (timeval *)0x0) || (iVar14 == -1)) goto LAB_0023060d;
      if ((tv_is_absolute == 0) && ((ev->ev_evcallback).evcb_closure == '\x02')) {
        _Var13 = tv->tv_usec;
        (ev->ev_).ev_io.ev_timeout.tv_sec = tv->tv_sec;
        (ev->ev_).ev_io.ev_timeout.tv_usec = _Var13;
      }
      if (((ev->ev_evcallback).evcb_flags & 1) != 0) {
        event_queue_remove_timeout(base,ev);
      }
      if ((((ev->ev_evcallback).evcb_flags & 8) != 0) && ((ev->ev_res & 1) != 0)) {
        if (((ev->ev_events & 8) != 0) &&
           (((ev->ev_).ev_signal.ev_ncalls != 0 &&
            (psVar5 = (ev->ev_).ev_signal.ev_pncalls, psVar5 != (short *)0x0)))) {
          *psVar5 = 0;
        }
        event_queue_remove_active(base,&ev->ev_evcallback);
      }
      gettime(base,&now);
      uVar16 = (uint)tv->tv_usec;
      bVar35 = true;
      if ((uVar16 & 0xf0000000) == 0x50000000) {
        bVar35 = base->n_common_timeouts <= (int)((uint)((ulong)tv->tv_usec >> 0x14) & 0xff);
      }
      if (tv_is_absolute == 0) {
        if (bVar35) {
          lVar20 = tv->tv_sec + now.tv_sec;
          (ev->ev_timeout).tv_sec = lVar20;
          lVar24 = tv->tv_usec + now.tv_usec;
          (ev->ev_timeout).tv_usec = lVar24;
          if (999999 < lVar24) {
            (ev->ev_timeout).tv_sec = lVar20 + 1;
            (ev->ev_timeout).tv_usec = lVar24 + -1000000;
          }
        }
        else {
          lVar24 = now.tv_sec + tv->tv_sec;
          (ev->ev_timeout).tv_sec = lVar24;
          lVar20 = (ulong)(uVar16 & 0xfffff) + now.tv_usec;
          (ev->ev_timeout).tv_usec = lVar20;
          if (999999 < lVar20) {
            (ev->ev_timeout).tv_sec = lVar24 + 1;
            (ev->ev_timeout).tv_usec = lVar20 + -1000000;
          }
          p_Var1 = &(ev->ev_timeout).tv_usec;
          *p_Var1 = *p_Var1 | tv->tv_usec & 0xfffffffffff00000U;
        }
      }
      else {
        _Var13 = tv->tv_usec;
        (ev->ev_timeout).tv_sec = tv->tv_sec;
        (ev->ev_timeout).tv_usec = _Var13;
      }
      if (event_debug_logging_mask_ != 0) {
        event_debugx_("event_add: event %p, timeout in %d seconds %d useconds, call %p",ev,
                      (ulong)(uint)tv->tv_sec,(ulong)(uint)tv->tv_usec,
                      (ev->ev_evcallback).evcb_cb_union.evcb_callback);
      }
      if (((base->th_base_lock == (void *)0x0) || (evthread_lock_debugging_enabled_ == 0)) ||
         (iVar17 = evthread_is_debug_lock_held_(base->th_base_lock), iVar17 != 0)) {
        uVar3 = (ev->ev_evcallback).evcb_flags;
        if ((uVar3 & 1) == 0) {
          iVar17 = base->event_count + (uint)((uVar3 & 0x10) == 0);
          base->event_count = iVar17;
          if (iVar17 < base->event_count_max) {
            iVar17 = base->event_count_max;
          }
          base->event_count_max = iVar17;
          psVar5 = &(ev->ev_evcallback).evcb_flags;
          *(byte *)psVar5 = (byte)*psVar5 | 1;
          ptVar2 = &ev->ev_timeout;
          uVar26 = (ev->ev_timeout).tv_usec;
          if ((((uint)uVar26 & 0xf0000000) == 0x50000000) &&
             ((int)((uint)(uVar26 >> 0x14) & 0xff) < base->n_common_timeouts)) {
            ppeVar18 = *(event ***)
                        ((long)base->common_timeout_queues + (ulong)((uint)(uVar26 >> 0x11) & 0x7f8)
                        );
            pppeVar25 = (event ***)(ppeVar18 + 1);
            peVar21 = ppeVar18[1];
            while (peVar6 = *(peVar21->ev_evcallback).evcb_active_next.tqe_prev,
                  peVar6 != (event_callback *)0x0) {
              peVar7 = peVar6[3].evcb_active_next.tqe_next;
              if (0xfffff < ((ulong)peVar7 ^ uVar26)) goto LAB_0023071a;
              pvVar8 = peVar6[2].evcb_arg;
              pvVar9 = (void *)ptVar2->tv_sec;
              bVar33 = SBORROW8((long)pvVar9,(long)pvVar8);
              lVar20 = (long)pvVar9 - (long)pvVar8;
              if (pvVar9 == pvVar8) {
                bVar33 = SBORROW8(uVar26,(long)peVar7);
                lVar20 = uVar26 - (long)peVar7;
              }
              if (bVar33 == lVar20 < 0) {
                peVar21 = (event *)peVar6[1].evcb_active_next.tqe_next;
                pppeVar28 = &(peVar21->ev_timeout_pos).ev_next_with_common_timeout.tqe_prev;
                if (peVar21 == (event *)0x0) {
                  pppeVar28 = pppeVar25;
                }
                (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_next = peVar21;
                *pppeVar28 = (event **)&ev->ev_timeout_pos;
                peVar6[1].evcb_active_next.tqe_next = &ev->ev_evcallback;
                (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_prev = (event **)(peVar6 + 1);
                goto LAB_0023057f;
              }
              peVar21 = (event *)peVar6[1].evcb_active_next.tqe_prev;
            }
            peVar21 = *ppeVar18;
            (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_next = peVar21;
            if (peVar21 != (event *)0x0) {
              pppeVar25 = &((*ppeVar18)->ev_timeout_pos).ev_next_with_common_timeout.tqe_prev;
            }
            *pppeVar25 = (event **)&ev->ev_timeout_pos;
            *ppeVar18 = ev;
            (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_prev = ppeVar18;
          }
          else {
            uVar16 = (base->timeheap).n;
            if (uVar16 != 0xffffffff) {
              uVar15 = (base->timeheap).a;
              if (uVar15 <= uVar16) {
                uVar31 = 8;
                if (uVar15 != 0) {
                  uVar31 = uVar15 * 2;
                }
                if (uVar31 <= uVar16 + 1) {
                  uVar31 = uVar16 + 1;
                }
                ppeVar18 = (base->timeheap).p;
                if (mm_realloc_fn_ == (_func_void_ptr_void_ptr_size_t *)0x0) {
                  ppeVar18 = (event **)realloc(ppeVar18,(ulong)uVar31 * 8);
                }
                else {
                  ppeVar18 = (event **)(*mm_realloc_fn_)(ppeVar18,(ulong)uVar31 * 8);
                }
                if (ppeVar18 == (event **)0x0) goto LAB_0023057f;
                (base->timeheap).p = ppeVar18;
                (base->timeheap).a = uVar31;
              }
              uVar16 = (base->timeheap).n;
              (base->timeheap).n = uVar16 + 1;
              if (uVar16 == 0) {
LAB_0023056d:
                uVar26 = (ulong)uVar16;
              }
              else {
                do {
                  uVar15 = uVar16 - 1;
                  uVar31 = uVar15 >> 1;
                  uVar26 = (ulong)uVar31;
                  ppeVar18 = (base->timeheap).p;
                  peVar21 = ppeVar18[uVar26];
                  lVar20 = ptVar2->tv_sec;
                  lVar24 = (peVar21->ev_timeout).tv_sec;
                  bVar34 = SBORROW8(lVar24,lVar20);
                  lVar12 = lVar24 - lVar20;
                  bVar33 = lVar24 == lVar20;
                  if (bVar33) {
                    lVar20 = (peVar21->ev_timeout).tv_usec;
                    lVar24 = (ev->ev_timeout).tv_usec;
                    bVar34 = SBORROW8(lVar20,lVar24);
                    lVar12 = lVar20 - lVar24;
                    bVar33 = lVar20 == lVar24;
                  }
                  if (bVar33 || bVar34 != lVar12 < 0) goto LAB_0023056d;
                  ppeVar18[uVar16] = peVar21;
                  (peVar21->ev_timeout_pos).min_heap_idx = uVar16;
                  uVar16 = uVar31;
                } while (1 < uVar15);
              }
              (base->timeheap).p[uVar26] = ev;
              (ev->ev_timeout_pos).min_heap_idx = (int)uVar26;
            }
          }
LAB_0023057f:
          if (bVar35) {
            if ((ev->ev_timeout_pos).min_heap_idx == 0) {
LAB_00230607:
              bVar32 = true;
            }
            else {
              if ((base->timeheap).n == 0) {
                peVar21 = (event *)0x0;
              }
              else {
                peVar21 = *(base->timeheap).p;
              }
              if (peVar21 != (event *)0x0) {
                lVar20 = (peVar21->ev_timeout).tv_sec;
                bVar35 = SBORROW8(lVar20,now.tv_sec);
                lVar24 = lVar20 - now.tv_sec;
                if (lVar20 == now.tv_sec) {
                  lVar24 = (peVar21->ev_timeout).tv_usec;
                  bVar35 = SBORROW8(lVar24,now.tv_usec);
                  lVar24 = lVar24 - now.tv_usec;
                }
                if (bVar35 != lVar24 < 0) goto LAB_00230607;
              }
            }
          }
          else {
            plVar10 = *(long **)((long)base->common_timeout_queues +
                                (ulong)((uint)(ev->ev_timeout).tv_usec >> 0x11 & 0x7f8));
            if ((event *)*plVar10 == ev) {
              local_48.tv_sec = ptVar2->tv_sec;
              local_48.tv_usec = (ev->ev_timeout).tv_usec & 0xfffff;
              event_add_nolock_((event *)(plVar10 + 4),&local_48,1);
            }
          }
LAB_0023060d:
          if ((((bool)(evthread_id_fn_ != (_func_unsigned_long *)0x0 & bVar32 & iVar14 != -1)) &&
              (base->running_loop != 0)) &&
             (uVar4 = base->th_owner_id, uVar19 = (*evthread_id_fn_)(), uVar4 != uVar19)) {
            evthread_notify_base(base);
          }
          if (event_debug_mode_on_ == 0) {
            event_debug_mode_too_late = 1;
            return iVar14;
          }
          if (event_debug_map_lock_ != (void *)0x0) {
            (*evthread_lock_fns_.lock)(0,event_debug_map_lock_);
          }
          if (global_debug_map.hth_table == (event_debug_entry **)0x0) {
            peVar22 = (event_debug_entry *)0x0;
          }
          else {
            peVar11 = (event_debug_entry *)
                      (global_debug_map.hth_table +
                      ((ulong)ev >> 6 & 0x3ffffff) % (ulong)global_debug_map.hth_table_length);
            do {
              peVar22 = peVar11;
              peVar11 = (peVar22->node).hte_next;
              if (peVar11 == (event_debug_entry *)0x0) break;
            } while (peVar11->ptr != ev);
          }
          if (peVar22 == (event_debug_entry *)0x0) {
            peVar22 = (event_debug_entry *)0x0;
          }
          else {
            peVar22 = (peVar22->node).hte_next;
          }
          if (peVar22 != (event_debug_entry *)0x0) {
            peVar22->field_0x10 = peVar22->field_0x10 | 1;
            if (event_debug_map_lock_ == (void *)0x0) {
              event_debug_mode_too_late = 1;
              return iVar14;
            }
            (*evthread_lock_fns_.unlock)(0,event_debug_map_lock_);
            event_debug_mode_too_late = 1;
            return iVar14;
          }
          goto LAB_0023073e;
        }
        goto LAB_00230724;
      }
      goto LAB_0023072c;
    }
    if ((uVar3 & 0x86) == 0) {
      iVar14 = 0;
      if ((uVar3 & 8) != 0) {
        iVar14 = evmap_signal_add_(base,ev->ev_fd,ev);
      }
    }
    else {
      iVar14 = evmap_io_add_(base,ev->ev_fd,ev);
    }
    if (iVar14 == -1) goto LAB_00230185;
    if (((base->th_base_lock == (void *)0x0) || (evthread_lock_debugging_enabled_ == 0)) ||
       (iVar17 = evthread_is_debug_lock_held_(base->th_base_lock), iVar17 != 0)) {
      uVar3 = (ev->ev_evcallback).evcb_flags;
      if ((uVar3 & 2) == 0) {
        iVar17 = base->event_count + (uint)((uVar3 & 0x10) == 0);
        base->event_count = iVar17;
        if (iVar17 < base->event_count_max) {
          iVar17 = base->event_count_max;
        }
        base->event_count_max = iVar17;
        psVar5 = &(ev->ev_evcallback).evcb_flags;
        *(byte *)psVar5 = (byte)*psVar5 | 2;
        bVar32 = iVar14 == 1;
        if (bVar32) {
          iVar14 = 0;
        }
        goto LAB_00230185;
      }
      goto LAB_00230731;
    }
  }
  else {
LAB_0023071f:
    event_add_nolock__cold_7();
LAB_00230724:
    event_add_nolock__cold_4();
LAB_0023072c:
    event_add_nolock__cold_6();
LAB_00230731:
    event_add_nolock__cold_2();
  }
  event_add_nolock__cold_3();
LAB_0023073e:
  event_errx(-0x21522153,
             "%s: noting an add on a non-setup event %p (events: 0x%x, fd: %d, flags: 0x%x)",
             "event_debug_note_add_",ev,(ulong)(uint)(int)ev->ev_events,(ulong)(uint)ev->ev_fd,
             (ulong)(uint)(int)(ev->ev_evcallback).evcb_flags);
}

Assistant:

int
event_add_nolock_(struct event *ev, const struct timeval *tv,
    int tv_is_absolute)
{
	struct event_base *base = ev->ev_base;
	int res = 0;
	int notify = 0;

	EVENT_BASE_ASSERT_LOCKED(base);
	event_debug_assert_is_setup_(ev);

	event_debug((
		 "event_add: event: %p (fd "EV_SOCK_FMT"), %s%s%s%scall %p",
		 ev,
		 EV_SOCK_ARG(ev->ev_fd),
		 ev->ev_events & EV_READ ? "EV_READ " : " ",
		 ev->ev_events & EV_WRITE ? "EV_WRITE " : " ",
		 ev->ev_events & EV_CLOSED ? "EV_CLOSED " : " ",
		 tv ? "EV_TIMEOUT " : " ",
		 ev->ev_callback));

	EVUTIL_ASSERT(!(ev->ev_flags & ~EVLIST_ALL));

	if (ev->ev_flags & EVLIST_FINALIZING) {
		/* XXXX debug */
		return (-1);
	}

	/*
	 * prepare for timeout insertion further below, if we get a
	 * failure on any step, we should not change any state.
	 */
	if (tv != NULL && !(ev->ev_flags & EVLIST_TIMEOUT)) {
		if (min_heap_reserve_(&base->timeheap,
			1 + min_heap_size_(&base->timeheap)) == -1)
			return (-1);  /* ENOMEM == errno */
	}

	/* If the main thread is currently executing a signal event's
	 * callback, and we are not the main thread, then we want to wait
	 * until the callback is done before we mess with the event, or else
	 * we can race on ev_ncalls and ev_pncalls below. */
#ifndef EVENT__DISABLE_THREAD_SUPPORT
	if (base->current_event == event_to_event_callback(ev) &&
	    (ev->ev_events & EV_SIGNAL)
	    && !EVBASE_IN_THREAD(base)) {
		++base->current_event_waiters;
		EVTHREAD_COND_WAIT(base->current_event_cond, base->th_base_lock);
	}
#endif

	if ((ev->ev_events & (EV_READ|EV_WRITE|EV_CLOSED|EV_SIGNAL)) &&
	    !(ev->ev_flags & (EVLIST_INSERTED|EVLIST_ACTIVE|EVLIST_ACTIVE_LATER))) {
		if (ev->ev_events & (EV_READ|EV_WRITE|EV_CLOSED))
			res = evmap_io_add_(base, ev->ev_fd, ev);
		else if (ev->ev_events & EV_SIGNAL)
			res = evmap_signal_add_(base, (int)ev->ev_fd, ev);
		if (res != -1)
			event_queue_insert_inserted(base, ev);
		if (res == 1) {
			/* evmap says we need to notify the main thread. */
			notify = 1;
			res = 0;
		}
	}

	/*
	 * we should change the timeout state only if the previous event
	 * addition succeeded.
	 */
	if (res != -1 && tv != NULL) {
		struct timeval now;
		int common_timeout;
#ifdef USE_REINSERT_TIMEOUT
		int was_common;
		int old_timeout_idx;
#endif

		/*
		 * for persistent timeout events, we remember the
		 * timeout value and re-add the event.
		 *
		 * If tv_is_absolute, this was already set.
		 */
		if (ev->ev_closure == EV_CLOSURE_EVENT_PERSIST && !tv_is_absolute)
			ev->ev_io_timeout = *tv;

#ifndef USE_REINSERT_TIMEOUT
		if (ev->ev_flags & EVLIST_TIMEOUT) {
			event_queue_remove_timeout(base, ev);
		}
#endif

		/* Check if it is active due to a timeout.  Rescheduling
		 * this timeout before the callback can be executed
		 * removes it from the active list. */
		if ((ev->ev_flags & EVLIST_ACTIVE) &&
		    (ev->ev_res & EV_TIMEOUT)) {
			if (ev->ev_events & EV_SIGNAL) {
				/* See if we are just active executing
				 * this event in a loop
				 */
				if (ev->ev_ncalls && ev->ev_pncalls) {
					/* Abort loop */
					*ev->ev_pncalls = 0;
				}
			}

			event_queue_remove_active(base, event_to_event_callback(ev));
		}

		gettime(base, &now);

		common_timeout = is_common_timeout(tv, base);
#ifdef USE_REINSERT_TIMEOUT
		was_common = is_common_timeout(&ev->ev_timeout, base);
		old_timeout_idx = COMMON_TIMEOUT_IDX(&ev->ev_timeout);
#endif

		if (tv_is_absolute) {
			ev->ev_timeout = *tv;
		} else if (common_timeout) {
			struct timeval tmp = *tv;
			tmp.tv_usec &= MICROSECONDS_MASK;
			evutil_timeradd(&now, &tmp, &ev->ev_timeout);
			ev->ev_timeout.tv_usec |=
			    (tv->tv_usec & ~MICROSECONDS_MASK);
		} else {
			evutil_timeradd(&now, tv, &ev->ev_timeout);
		}

		event_debug((
			 "event_add: event %p, timeout in %d seconds %d useconds, call %p",
			 ev, (int)tv->tv_sec, (int)tv->tv_usec, ev->ev_callback));

#ifdef USE_REINSERT_TIMEOUT
		event_queue_reinsert_timeout(base, ev, was_common, common_timeout, old_timeout_idx);
#else
		event_queue_insert_timeout(base, ev);
#endif

		if (common_timeout) {
			struct common_timeout_list *ctl =
			    get_common_timeout_list(base, &ev->ev_timeout);
			if (ev == TAILQ_FIRST(&ctl->events)) {
				common_timeout_schedule(ctl, &now, ev);
			}
		} else {
			struct event* top = NULL;
			/* See if the earliest timeout is now earlier than it
			 * was before: if so, we will need to tell the main
			 * thread to wake up earlier than it would otherwise.
			 * We double check the timeout of the top element to
			 * handle time distortions due to system suspension.
			 */
			if (min_heap_elt_is_top_(ev))
				notify = 1;
			else if ((top = min_heap_top_(&base->timeheap)) != NULL &&
					 evutil_timercmp(&top->ev_timeout, &now, <))
				notify = 1;
		}
	}

	/* if we are not in the right thread, we need to wake up the loop */
	if (res != -1 && notify && EVBASE_NEED_NOTIFY(base))
		evthread_notify_base(base);

	event_debug_note_add_(ev);

	return (res);
}